

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridtestExternalTests.cpp
# Opt level: O2

bool __thiscall
ExternalTester::testAnisotropicRefinement
          (ExternalTester *this,BaseFunction *f,TasmanianSparseGrid *grid,TypeDepth type,
          int min_growth,int *np,double *errs,int max_iter)

{
  double dVar1;
  byte bVar2;
  ostream *poVar3;
  int *piVar4;
  ulong uVar5;
  ulong uVar6;
  TestResults TVar7;
  _Vector_base<double,_std::allocator<double>_> local_48;
  
  uVar5 = 0;
  uVar6 = 0;
  if (0 < max_iter) {
    uVar6 = (ulong)(uint)max_iter;
  }
  do {
    if (uVar6 == uVar5) {
LAB_0011d1a3:
      return (long)max_iter <= (long)uVar5;
    }
    local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    TVar7 = getError(this,f,grid,type_internal_interpolation,
                     (vector<double,_std::allocator<double>_> *)&local_48);
    dVar1 = TVar7.error;
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_48);
    if (TVar7.num_points != np[uVar5]) {
LAB_0011d0ee:
      *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) =
           0x12;
      poVar3 = std::operator<<((ostream *)&std::cout,"ERROR: FAILED refinement test at iteration: ")
      ;
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,(int)uVar5);
      std::endl<char,std::char_traits<char>>(poVar3);
      poVar3 = std::operator<<((ostream *)&std::cout," expected: ");
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,np[uVar5]);
      std::operator<<(poVar3,"  ");
      poVar3 = std::ostream::_M_insert<double>(errs[uVar5]);
      poVar3 = std::operator<<(poVar3,"   computed: ");
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,TVar7.num_points);
      std::operator<<(poVar3,"  ");
      poVar3 = std::ostream::_M_insert<double>(dVar1);
      std::endl<char,std::char_traits<char>>(poVar3);
      goto LAB_0011d1a3;
    }
    if (errs[uVar5] <= dVar1 && dVar1 != errs[uVar5]) goto LAB_0011d0ee;
    piVar4 = (int *)0xffffffffffffffff;
    if (*(long **)(grid + 8) != (long *)0x0) {
      bVar2 = (**(code **)(**(long **)(grid + 8) + 0x10))();
      piVar4 = (int *)(ulong)(bVar2 - 1);
    }
    TasGrid::TasmanianSparseGrid::setAnisotropicRefinement((TypeDepth)grid,type,min_growth,piVar4);
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

bool ExternalTester::testAnisotropicRefinement(const BaseFunction *f, TasmanianSparseGrid &grid, TypeDepth type, int min_growth, const int np[], const double errs[], int max_iter ) const{
    for(int itr=0; itr<max_iter; itr++){
        TestResults R = getError(f, grid, type_internal_interpolation);
        if ( (R.num_points != np[itr]) || (R.error > errs[itr]) ){
            cout << setw(18) << "ERROR: FAILED refinement test at iteration: " << itr << endl;
            cout << " expected: " << np[itr] << "  " << errs[itr] << "   computed: " << R.num_points << "  " << R.error << endl;
            return false;
        }
        grid.setAnisotropicRefinement(type, min_growth, (grid.isGlobal()) ? 0 : -1);
    }
    return true;
}